

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_file.cc
# Opt level: O2

bool google::protobuf::compiler::java::anon_unknown_10::CollectExtensions
               (Message *message,
               vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
               *extensions)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  JavaType JVar4;
  undefined4 extraout_var;
  long *plVar6;
  Message *pMVar7;
  ulong uVar8;
  int i;
  ulong uVar9;
  FieldDescriptor *field;
  int iVar10;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  fields;
  _Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  local_48;
  long *plVar5;
  
  iVar3 = (*(message->super_MessageLite)._vptr_MessageLite[0x12])();
  plVar5 = (long *)CONCAT44(extraout_var,iVar3);
  plVar6 = (long *)(**(code **)(*plVar5 + 0x10))(plVar5,message);
  plVar6 = (long *)*plVar6;
  if ((plVar6 == (long *)0x0) || ((int)((ulong)(plVar6[1] - *plVar6) >> 4) < 1)) {
    local_48._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_48._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_48._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (**(code **)(*plVar5 + 0x60))(plVar5,message);
    for (uVar9 = 0;
        uVar8 = (long)local_48._M_impl.super__Vector_impl_data._M_finish -
                (long)local_48._M_impl.super__Vector_impl_data._M_start >> 3, bVar2 = uVar8 <= uVar9
        , uVar9 < uVar8; uVar9 = uVar9 + 1) {
      field = local_48._M_impl.super__Vector_impl_data._M_start[uVar9];
      if (field[0x34] == (FieldDescriptor)0x1) {
        std::
        vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
        ::push_back(extensions,local_48._M_impl.super__Vector_impl_data._M_start + uVar9);
        field = local_48._M_impl.super__Vector_impl_data._M_start[uVar9];
      }
      JVar4 = GetJavaType(field);
      if (JVar4 == JAVATYPE_MESSAGE) {
        if (*(int *)(local_48._M_impl.super__Vector_impl_data._M_start[uVar9] + 0x30) == 3) {
          iVar3 = (**(code **)(*plVar5 + 0x30))(plVar5,message);
          iVar10 = 0;
          if (iVar3 < 1) {
            iVar3 = iVar10;
          }
          while (iVar3 != iVar10) {
            pMVar7 = (Message *)
                     (**(code **)(*plVar5 + 0x160))
                               (plVar5,message,
                                local_48._M_impl.super__Vector_impl_data._M_start[uVar9],iVar10);
            bVar1 = CollectExtensions(pMVar7,extensions);
            iVar10 = iVar10 + 1;
            if (!bVar1) goto LAB_001bd87d;
          }
        }
        else {
          pMVar7 = (Message *)
                   (**(code **)(*plVar5 + 0xb0))
                             (plVar5,message,
                              local_48._M_impl.super__Vector_impl_data._M_start[uVar9],0);
          bVar1 = CollectExtensions(pMVar7,extensions);
          if (!bVar1) break;
        }
      }
    }
LAB_001bd87d:
    std::
    _Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
    ::~_Vector_base(&local_48);
  }
  else {
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool CollectExtensions(const Message& message,
                       vector<const FieldDescriptor*>* extensions) {
  const Reflection* reflection = message.GetReflection();

  // There are unknown fields that could be extensions, thus this call fails.
  if (reflection->GetUnknownFields(message).field_count() > 0) return false;

  vector<const FieldDescriptor*> fields;
  reflection->ListFields(message, &fields);

  for (int i = 0; i < fields.size(); i++) {
    if (fields[i]->is_extension()) extensions->push_back(fields[i]);

    if (GetJavaType(fields[i]) == JAVATYPE_MESSAGE) {
      if (fields[i]->is_repeated()) {
        int size = reflection->FieldSize(message, fields[i]);
        for (int j = 0; j < size; j++) {
          const Message& sub_message =
            reflection->GetRepeatedMessage(message, fields[i], j);
          if (!CollectExtensions(sub_message, extensions)) return false;
        }
      } else {
        const Message& sub_message = reflection->GetMessage(message, fields[i]);
        if (!CollectExtensions(sub_message, extensions)) return false;
      }
    }
  }

  return true;
}